

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

AncillaryMessage * __thiscall
kj::Vector<kj::AncillaryMessage>::add<kj::AncillaryMessage>
          (Vector<kj::AncillaryMessage> *this,AncillaryMessage *params)

{
  bool bVar1;
  AncillaryMessage *pAVar2;
  AncillaryMessage *params_local;
  Vector<kj::AncillaryMessage> *this_local;
  
  bVar1 = ArrayBuilder<kj::AncillaryMessage>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  pAVar2 = fwd<kj::AncillaryMessage>(params);
  pAVar2 = ArrayBuilder<kj::AncillaryMessage>::add<kj::AncillaryMessage>(&this->builder,pAVar2);
  return pAVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }